

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::CommandCompare::compareLevelIndex(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char **ppcVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  pointer pKVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  uint uVar7;
  long lVar8;
  InputStreams *pIVar9;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar10;
  long lVar11;
  undefined **in_R9;
  undefined **ppuVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  char *pcVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  ktxLevelIndexEntry entry;
  uint32_t numLevels [2];
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  string local_188;
  string local_160;
  PrintDiff *local_140;
  DiffBase<unsigned_long> local_138;
  char *local_e8;
  size_t sStack_e0;
  undefined1 auStack_d3 [3];
  undefined8 local_d0;
  long local_c8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_c0;
  long local_b8;
  byte local_b0;
  long local_a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a0;
  long local_98;
  byte local_90;
  char *local_80;
  InputStreams *local_78;
  long local_70;
  long local_68;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_60;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  char *pcStack_38;
  
  if ((this->options).super_OptionsCompare.ignoreIndex == none) {
    ppcVar1 = &local_138.textHeader._M_str;
    local_140 = diff;
    local_138._vptr_DiffBase = (_func_int **)ppcVar1;
    local_78 = streams;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Level Index\n\n","");
    this_00 = &local_140->context;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,(local_140->context).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138);
    if (local_138._vptr_DiffBase != (_func_int **)ppcVar1) {
      operator_delete(local_138._vptr_DiffBase,(ulong)(local_138.textHeader._M_str + 1));
    }
    pKVar4 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    kVar2 = pKVar4->levelCount;
    local_d0._0_4_ = kVar2 + (kVar2 == 0);
    uVar3 = pKVar4[1].levelCount;
    local_d0._4_4_ = uVar3 + (uVar3 == 0);
    uVar7 = local_d0._4_4_;
    if (uVar3 <= (uint)local_d0) {
      uVar7 = (uint)local_d0;
    }
    if (uVar7 != 0) {
      local_80 = (char *)(ulong)uVar7;
      pcVar15 = (char *)0x0;
      do {
        lVar8 = 0x18;
        do {
          *(undefined1 *)((long)&local_c8 + lVar8) = 0;
          lVar8 = lVar8 + 0x20;
        } while (lVar8 != 0x58);
        lVar8 = 3;
        pIVar9 = local_78;
        do {
          if (pcVar15 < (char *)(ulong)*(uint *)(auStack_d3 + lVar8)) {
            local_40 = 0xf;
            pcStack_38 = "the level index";
            read(this,(int)pIVar9,(void *)((long)pcVar15 * 0x18 + 0x50),(size_t)&local_138);
            (&sStack_e0)[lVar8] = (size_t)local_138._vptr_DiffBase;
            *(size_t *)(&stack0xffffffffffffff28 + lVar8 * 8) = local_138.textHeader._M_len;
            (&local_d0)[lVar8] = local_138.textHeader._M_str;
            if ((char)(&local_c8)[lVar8] == '\0') {
              *(undefined1 *)(&local_c8 + lVar8) = 1;
            }
          }
          lVar8 = lVar8 + 4;
          pIVar9 = (InputStreams *)&pIVar9->field_0x3b8;
        } while (lVar8 == 7);
        fmt.size_ = 2;
        fmt.data_ = (char *)0x12;
        args.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9;
        args.desc_ = (unsigned_long_long)&local_188;
        local_188._M_dataplus._M_p = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_(&local_160,(v10 *)"Level{}.byteOffset",fmt,args);
        sVar6 = local_160._M_string_length;
        _Var5._M_p = local_160._M_dataplus._M_p;
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x1b;
        args_00.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9;
        args_00.desc_ = (unsigned_long_long)&local_e8;
        local_e8 = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_188,(v10 *)"/index/levels/{}/byteOffset",fmt_00,args_00);
        ppuVar12 = &PTR___cxa_pure_virtual_0025f1a0;
        local_138.textHeader._M_len = sVar6;
        local_138.textHeader._M_str = _Var5._M_p;
        local_138.jsonPath._M_len = local_188._M_string_length;
        local_138.jsonPath._M_str = local_188._M_dataplus._M_p;
        lVar8 = 0x30;
        do {
          *(undefined1 *)((long)local_138.values + lVar8 + -0x28) = 0;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x50);
        lVar8 = local_48;
        if ((local_b0 & 1) != 0) {
          lVar8 = local_c8;
        }
        lVar11 = local_50;
        if (local_90 != 0) {
          lVar11 = local_a8;
        }
        local_138.different = (bool)(lVar8 != lVar11 & local_b0 | local_b0 != local_90);
        local_138.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_b0;
        local_138.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_90;
        local_138._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025f160;
        PrintDiff::operator<<(local_140,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        local_50 = lVar11;
        local_48 = lVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        fmt_01.size_ = 2;
        fmt_01.data_ = (char *)0x12;
        args_01.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)ppuVar12;
        args_01.desc_ = (unsigned_long_long)&local_188;
        local_188._M_dataplus._M_p = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_(&local_160,(v10 *)"Level{}.byteLength",fmt_01,args_01);
        sVar6 = local_160._M_string_length;
        _Var5._M_p = local_160._M_dataplus._M_p;
        fmt_02.size_ = 2;
        fmt_02.data_ = (char *)0x1b;
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)ppuVar12;
        args_02.desc_ = (unsigned_long_long)&local_e8;
        local_e8 = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_188,(v10 *)"/index/levels/{}/byteLength",fmt_02,args_02);
        local_138.textHeader._M_len = sVar6;
        local_138.textHeader._M_str = _Var5._M_p;
        local_138.jsonPath._M_len = local_188._M_string_length;
        local_138.jsonPath._M_str = local_188._M_dataplus._M_p;
        lVar8 = 0x30;
        do {
          *(undefined1 *)((long)local_138.values + lVar8 + -0x28) = 0;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x50);
        aVar14 = local_60;
        if ((local_b0 & 1) != 0) {
          aVar14 = local_c0;
        }
        pvVar10 = local_58;
        if (local_90 != 0) {
          pvVar10 = local_a0;
        }
        local_138.different = (bool)(aVar14.values_ != pvVar10 & local_b0 | local_b0 != local_90);
        local_138.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_b0;
        local_138.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_90;
        local_138._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025f1b8;
        aVar13 = local_c0;
        PrintDiff::operator<<(local_140,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        local_60 = aVar14;
        local_58 = pvVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        fmt_03.size_ = 2;
        fmt_03.data_ = (char *)0x1e;
        args_03.field_1.values_ = aVar13.values_;
        args_03.desc_ = (unsigned_long_long)&local_188;
        local_188._M_dataplus._M_p = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_160,(v10 *)"Level{}.uncompressedByteLength",fmt_03,args_03);
        sVar6 = local_160._M_string_length;
        _Var5._M_p = local_160._M_dataplus._M_p;
        fmt_04.size_ = 2;
        fmt_04.data_ = (char *)0x27;
        args_04.field_1.values_ = aVar13.values_;
        args_04.desc_ = (unsigned_long_long)&local_e8;
        local_e8 = pcVar15;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_188,(v10 *)"/index/levels/{}/uncompressedByteLength",fmt_04,args_04);
        in_R9 = &PTR___cxa_pure_virtual_0025f1a0;
        local_138.textHeader._M_len = sVar6;
        local_138.textHeader._M_str = _Var5._M_p;
        local_138.jsonPath._M_len = local_188._M_string_length;
        local_138.jsonPath._M_str = local_188._M_dataplus._M_p;
        lVar8 = 0x30;
        do {
          *(undefined1 *)((long)local_138.values + lVar8 + -0x28) = 0;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x50);
        lVar8 = local_70;
        if ((local_b0 & 1) != 0) {
          lVar8 = local_b8;
        }
        lVar11 = local_68;
        if (local_90 != 0) {
          lVar11 = local_98;
        }
        local_138.different = (bool)(lVar8 != lVar11 & local_b0 | local_b0 != local_90);
        local_138.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_b0;
        local_138.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_90;
        local_138._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025f1b8;
        PrintDiff::operator<<(local_140,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = pcVar15 + 1;
        local_70 = lVar8;
        local_68 = lVar11;
      } while (pcVar15 != local_80);
    }
  }
  return;
}

Assistant:

void CommandCompare::compareLevelIndex(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreIndex != IgnoreIndex::none) return;

    diff.setContext("Level Index\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        diff << DiffHex(fmt::format("Level{}.byteOffset", level),
            fmt::format("/index/levels/{}/byteOffset", level),
            OPT_FIELDS(levelIndexEntry, byteOffset));
        diff << Diff(fmt::format("Level{}.byteLength", level),
            fmt::format("/index/levels/{}/byteLength", level),
            OPT_FIELDS(levelIndexEntry, byteLength));
        diff << Diff(fmt::format("Level{}.uncompressedByteLength", level),
            fmt::format("/index/levels/{}/uncompressedByteLength", level),
            OPT_FIELDS(levelIndexEntry, uncompressedByteLength));
    }
}